

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void amrex::anon_unknown_12::read_file
               (char *fname,
               list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *tab)

{
  _Bit_iterator __first;
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  istream *piVar4;
  reference pcVar5;
  char *in_RDI;
  reference rVar6;
  iterator iVar7;
  _Bit_iterator _Var8;
  char *b;
  string filestring_cxx;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  r;
  bool r_2;
  bool r_1;
  smatch sm;
  string line;
  vector<bool,_std::allocator<bool>_> has_true;
  vector<bool,_std::allocator<bool>_> valid_region;
  regex endif_regex;
  regex else_regex;
  regex elif_regex;
  regex if_regex;
  bool fortran_namelist;
  ostringstream os_fortran;
  ostringstream os_cxx;
  istringstream is;
  string filename;
  Vector<char,_std::allocator<char>_> fileCharPtr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6c8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffff6d0;
  ostream *in_stack_fffffffffffff6d8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffff6e0;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffff6e8;
  undefined7 in_stack_fffffffffffff6f0;
  undefined1 in_stack_fffffffffffff6f7;
  undefined4 in_stack_fffffffffffff700;
  flag_type in_stack_fffffffffffff704;
  iterator in_stack_fffffffffffff708;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffff710;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffff718;
  undefined8 in_stack_fffffffffffff720;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff728;
  iterator in_stack_fffffffffffff730;
  undefined7 in_stack_fffffffffffff7b8;
  undefined1 in_stack_fffffffffffff7bf;
  char **in_stack_fffffffffffff7c0;
  string local_7b0 [32];
  string local_790 [32];
  char *local_770;
  char *local_768;
  string local_760 [40];
  char *local_738;
  char *local_730;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_728;
  _Bit_type *local_720;
  uint local_718;
  _Bit_type *local_710;
  uint local_708;
  _Bit_type *local_700;
  uint local_6f8;
  undefined1 local_6e9;
  _Bit_type *local_6e8;
  uint local_6e0;
  _Bit_type *local_6d8;
  uint local_6d0;
  _Bit_type *local_6c8;
  uint local_6c0;
  _Bit_type *local_6b8;
  uint local_6b0;
  _Bit_type *local_6a8;
  uint local_6a0;
  reference local_698;
  _Bit_type *in_stack_fffffffffffff978;
  _Bit_type in_stack_fffffffffffff980;
  undefined1 bExitOnError;
  Vector<char,_std::allocator<char>_> *in_stack_fffffffffffff988;
  string *in_stack_fffffffffffff990;
  reference local_668;
  reference local_658;
  reference local_648;
  byte local_631;
  reference local_630;
  undefined1 local_619;
  undefined4 local_5f4;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_5f0 [7];
  byte local_4f9;
  ostringstream local_4f8 [376];
  ostringstream local_380 [383];
  allocator local_201;
  string local_200 [32];
  istringstream local_1e0 [384];
  MPI_Comm local_60;
  allocator local_49;
  string local_48 [64];
  char *local_8;
  
  bExitOnError = (undefined1)(in_stack_fffffffffffff980 >> 0x38);
  if ((in_RDI != (char *)0x0) && (*in_RDI != '\0')) {
    local_8 = in_RDI;
    Vector<char,_std::allocator<char>_>::Vector((Vector<char,_std::allocator<char>_> *)0xf14c07);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,local_8,&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_60 = ParallelDescriptor::Communicator();
    ParallelDescriptor::ReadAndBcastFile
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988,(bool)bExitOnError,
               (MPI_Comm *)in_stack_fffffffffffff978);
    pcVar3 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0xf14c95);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,pcVar3,&local_201);
    std::__cxx11::istringstream::istringstream(local_1e0,local_200,_S_in);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    std::__cxx11::ostringstream::ostringstream(local_380,_S_out);
    std::__cxx11::ostringstream::ostringstream(local_4f8,_S_out);
    local_4f9 = 0;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (in_stack_fffffffffffff710,in_stack_fffffffffffff708._M_current,
               in_stack_fffffffffffff704);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (in_stack_fffffffffffff710,in_stack_fffffffffffff708._M_current,
               in_stack_fffffffffffff704);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (in_stack_fffffffffffff710,in_stack_fffffffffffff708._M_current,
               in_stack_fffffffffffff704);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (in_stack_fffffffffffff710,in_stack_fffffffffffff708._M_current,
               in_stack_fffffffffffff704);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)0xf14db0);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)0xf14dbd);
    std::__cxx11::string::string((string *)local_5f0);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1e0,(string *)local_5f0);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) break;
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)in_stack_fffffffffffff6d0);
      bVar2 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
                         in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
                         (match_flag_type)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
      if (bVar2) {
        local_619 = anon_unknown_0::isTrue((smatch *)in_stack_fffffffffffff728._M_current);
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff730._M_current,
                   SUB81((ulong)in_stack_fffffffffffff728._M_current >> 0x38,0));
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff730._M_current,
                   SUB81((ulong)in_stack_fffffffffffff728._M_current >> 0x38,0));
        local_5f4 = 3;
      }
      else {
        bVar2 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
                           in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
                           (match_flag_type)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
        if (bVar2) {
          rVar6 = std::vector<bool,_std::allocator<bool>_>::back
                            ((vector<bool,_std::allocator<bool>_> *)
                             CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
          local_630 = rVar6;
          bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_630);
          if (bVar2) {
            rVar6 = std::vector<bool,_std::allocator<bool>_>::back
                              ((vector<bool,_std::allocator<bool>_> *)
                               CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
            in_stack_fffffffffffff7c0 = (char **)rVar6._M_mask;
            local_668 = rVar6;
            std::_Bit_reference::operator=(&local_668,false);
          }
          else {
            bVar2 = anon_unknown_0::isTrue((smatch *)in_stack_fffffffffffff728._M_current);
            local_631 = bVar2;
            rVar6 = std::vector<bool,_std::allocator<bool>_>::back
                              ((vector<bool,_std::allocator<bool>_> *)
                               CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
            local_648 = rVar6;
            std::_Bit_reference::operator=(&local_648,bVar2);
            bVar1 = local_631;
            rVar6 = std::vector<bool,_std::allocator<bool>_>::back
                              ((vector<bool,_std::allocator<bool>_> *)
                               CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
            local_658 = rVar6;
            std::_Bit_reference::operator=(&local_658,(bool)(bVar1 & 1));
          }
          local_5f4 = 3;
        }
        else {
          in_stack_fffffffffffff7bf =
               std::
               regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
                          in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
                          (match_flag_type)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
          if ((bool)in_stack_fffffffffffff7bf) {
            std::vector<bool,_std::allocator<bool>_>::back
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
            bVar2 = std::_Bit_reference::operator_cast_to_bool
                              ((_Bit_reference *)&stack0xfffffffffffff988);
            if (bVar2) {
              rVar6 = std::vector<bool,_std::allocator<bool>_>::back
                                ((vector<bool,_std::allocator<bool>_> *)
                                 CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
              local_698 = rVar6;
              std::_Bit_reference::operator=(&local_698,false);
            }
            else {
              std::vector<bool,_std::allocator<bool>_>::back
                        ((vector<bool,_std::allocator<bool>_> *)
                         CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
              std::_Bit_reference::operator=((_Bit_reference *)&stack0xfffffffffffff978,true);
            }
            local_5f4 = 3;
          }
          else {
            bVar2 = std::
                    regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
                               in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
                               (match_flag_type)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
            if (bVar2) {
              std::vector<bool,_std::allocator<bool>_>::pop_back
                        ((vector<bool,_std::allocator<bool>_> *)0xf1539f);
              std::vector<bool,_std::allocator<bool>_>::pop_back
                        ((vector<bool,_std::allocator<bool>_> *)0xf153ae);
              local_5f4 = 3;
            }
            else {
              iVar7 = std::begin<std::vector<bool,std::allocator<bool>>>
                                ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff6d0);
              local_6c8 = iVar7.super__Bit_iterator_base._M_p;
              local_6c0 = iVar7.super__Bit_iterator_base._M_offset;
              local_6b8 = local_6c8;
              local_6b0 = local_6c0;
              iVar7 = std::end<std::vector<bool,std::allocator<bool>>>
                                ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff6d0);
              local_6e8 = iVar7.super__Bit_iterator_base._M_p;
              local_6e0 = iVar7.super__Bit_iterator_base._M_offset;
              local_6e9 = 0;
              __first.super__Bit_iterator_base._8_8_ = in_stack_fffffffffffff720;
              __first.super__Bit_iterator_base._M_p = (_Bit_type *)in_stack_fffffffffffff718;
              _Var8.super__Bit_iterator_base._8_8_ = in_stack_fffffffffffff710;
              _Var8.super__Bit_iterator_base._M_p =
                   (_Bit_type *)in_stack_fffffffffffff708._M_current;
              local_6d8 = local_6e8;
              local_6d0 = local_6e0;
              _Var8 = std::find<std::_Bit_iterator,bool>
                                (__first,_Var8,
                                 (bool *)CONCAT44(in_stack_fffffffffffff704,
                                                  in_stack_fffffffffffff700));
              local_700 = _Var8.super__Bit_iterator_base._M_p;
              local_6f8 = _Var8.super__Bit_iterator_base._M_offset;
              local_6a8 = local_700;
              local_6a0 = local_6f8;
              iVar7 = std::end<std::vector<bool,std::allocator<bool>>>
                                ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff6d0);
              local_720 = iVar7.super__Bit_iterator_base._M_p;
              local_718 = iVar7.super__Bit_iterator_base._M_offset;
              local_710 = local_720;
              local_708 = local_718;
              bVar2 = std::operator!=((_Bit_iterator_base *)in_stack_fffffffffffff6d0,
                                      (_Bit_iterator_base *)in_stack_fffffffffffff6c8);
              if (bVar2) {
                local_5f4 = 3;
              }
              else {
                local_730 = (char *)std::begin<std::__cxx11::string>(in_stack_fffffffffffff6c8);
                in_stack_fffffffffffff730 =
                     std::end<std::__cxx11::string>(in_stack_fffffffffffff6c8);
                local_738 = in_stack_fffffffffffff730._M_current;
                in_stack_fffffffffffff728 =
                     std::
                     find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                               (local_730,in_stack_fffffffffffff730._M_current);
                local_728 = in_stack_fffffffffffff728;
                if ((local_4f9 & 1) == 0) {
                  local_770 = (char *)std::end<std::__cxx11::string>(in_stack_fffffffffffff6c8);
                  bVar2 = __gnu_cxx::operator!=
                                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_stack_fffffffffffff6d0,
                                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_stack_fffffffffffff6c8);
                  in_stack_fffffffffffff6f7 = false;
                  if (bVar2) {
                    pcVar5 = __gnu_cxx::
                             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*(&local_728);
                    in_stack_fffffffffffff6f7 = *pcVar5 == '&';
                  }
                  if ((bool)in_stack_fffffffffffff6f7 == false) {
                    in_stack_fffffffffffff6d0 =
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                         std::operator<<((ostream *)local_380,(string *)local_5f0);
                    std::operator<<((ostream *)in_stack_fffffffffffff6d0,"\n");
                  }
                  else {
                    in_stack_fffffffffffff6e8 =
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)0x0;
                    in_stack_fffffffffffff6e0 = local_5f0;
                    std::__cxx11::string::find((char)in_stack_fffffffffffff6e0,0x21);
                    std::__cxx11::string::substr((ulong)local_790,(ulong)in_stack_fffffffffffff6e0);
                    in_stack_fffffffffffff6d8 = std::operator<<((ostream *)local_4f8,local_790);
                    std::operator<<(in_stack_fffffffffffff6d8," ");
                    std::__cxx11::string::~string(local_790);
                    local_4f9 = 1;
                  }
                }
                else {
                  in_stack_fffffffffffff720 = 0;
                  in_stack_fffffffffffff718 = local_5f0;
                  std::__cxx11::string::find((char)in_stack_fffffffffffff718,0x21);
                  std::__cxx11::string::substr((ulong)local_760,(ulong)in_stack_fffffffffffff718);
                  in_stack_fffffffffffff710 =
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                       std::operator<<((ostream *)local_4f8,local_760);
                  std::operator<<((ostream *)in_stack_fffffffffffff710," ");
                  std::__cxx11::string::~string(local_760);
                  in_stack_fffffffffffff708 =
                       std::end<std::__cxx11::string>(in_stack_fffffffffffff6c8);
                  local_768 = in_stack_fffffffffffff708._M_current;
                  bVar2 = __gnu_cxx::operator!=
                                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_stack_fffffffffffff6d0,
                                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_stack_fffffffffffff6c8);
                  in_stack_fffffffffffff704 = in_stack_fffffffffffff704 & 0xffffff;
                  if (bVar2) {
                    pcVar5 = __gnu_cxx::
                             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*(&local_728);
                    in_stack_fffffffffffff704 =
                         CONCAT13(*pcVar5 == '/',(int3)in_stack_fffffffffffff704);
                  }
                  if ((char)(in_stack_fffffffffffff704 >> 0x18) != '\0') {
                    local_4f9 = 0;
                  }
                }
                local_5f4 = 0;
              }
            }
          }
        }
      }
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)0xf1586e);
    }
    local_5f4 = 2;
    std::__cxx11::string::~string((string *)local_5f0);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::c_str();
    bldTable(in_stack_fffffffffffff7c0,
             (list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
             CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8));
    std::__cxx11::string::~string(local_7b0);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0xf15901);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0xf1590e);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              (in_stack_fffffffffffff6d0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              (in_stack_fffffffffffff6d0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              (in_stack_fffffffffffff6d0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              (in_stack_fffffffffffff6d0);
    std::__cxx11::ostringstream::~ostringstream(local_4f8);
    std::__cxx11::ostringstream::~ostringstream(local_380);
    std::__cxx11::istringstream::~istringstream(local_1e0);
    std::__cxx11::string::~string(local_48);
    Vector<char,_std::allocator<char>_>::~Vector((Vector<char,_std::allocator<char>_> *)0xf15983);
  }
  return;
}

Assistant:

static void
read_file (const char*                     fname,
           std::list<ParmParse::PP_entry>& tab)
{
    //
    // Space for input file if it exists.
    //
    if ( fname != 0 && fname[0] != 0 )
    {
        Vector<char> fileCharPtr;
        std::string filename = fname;
        ParallelDescriptor::ReadAndBcastFile(filename, fileCharPtr);

        std::istringstream is(fileCharPtr.data());
        std::ostringstream os_cxx(std::ios_base::out);
        std::ostringstream os_fortran(std::ios_base::out);
        bool fortran_namelist = false;
        std::regex if_regex("^\\s*#\\s*if\\s+\\(?\\s*AMREX_SPACEDIM\\s*(>|<|==|>=|<=)\\s*([1-3])\\s*\\)?\\s*$");
        std::regex elif_regex("^\\s*#\\s*elif\\s+\\(?\\s*AMREX_SPACEDIM\\s*(>|<|==|>=|<=)\\s*([1-3])\\s*\\)?\\s*$");
        std::regex else_regex("^\\s*#\\s*else\\s*$");
        std::regex endif_regex("^\\s*#\\s*endif\\s*$");
        std::vector<bool> valid_region;  // Keep this block or not?
        std::vector<bool> has_true;      // Has previous if/elif ever been true?
        for (std::string line; std::getline(is, line); ) {
            std::smatch sm;
            if (std::regex_match(line, sm, if_regex)) {
                bool r = isTrue(sm);
                valid_region.push_back(r);
                has_true.push_back(r);
                continue;
            } else if (std::regex_match(line, sm, elif_regex)) {
                if (has_true.back() == false) {
                    // If none of the previous if/elif is true
                    bool r = isTrue(sm);
                    valid_region.back() = r;
                    has_true.back() = r;
                } else {
                    // If any of the previous if/elif is true
                    valid_region.back() = false;
                }
                continue;
            } else if (std::regex_match(line, sm, else_regex)) {
                if (has_true.back() == false) {
                    // If none of the previous if/elif is true,
                    valid_region.back() = true;
                } else {
                    valid_region.back() = false;
                }
                continue;
            } else if (std::regex_match(line, sm, endif_regex)) {
                valid_region.pop_back();
                has_true.pop_back();
                continue;
            }

            if (std::find(std::begin(valid_region), std::end(valid_region), false)
                != std::end(valid_region)) {
                continue;
            }

            auto r = std::find_if(std::begin(line), std::end(line),
                                  [](int c) -> bool { return !std::isspace(c); });
            if (fortran_namelist) { // already inside fortran namelist
                // os_fortran << line << "\n";
                // pgi and ibm do not like `\n`.  We strip comments for them too.
                os_fortran << line.substr(0, line.find('!')) << " ";
                if (r != std::end(line) && *r == '/') {
                    fortran_namelist = false; // end of Fortran namelist
                }
            } else if (r != std::end(line) && *r == '&') {
                // os_fortran << line << "\n";
                // pgi and ibm do not like `\n`.  We strip comments for them too.
                os_fortran << line.substr(0, line.find('!')) << " ";
                fortran_namelist = true;  // begin of Fortran namelist
            } else {
                os_cxx << line << "\n";
            }
        }

        std::string filestring_cxx = os_cxx.str();
        const char* b = filestring_cxx.c_str();
        bldTable(b, tab);

#if !defined(BL_NO_FORT)
        std::string filestring_fortran = os_fortran.str();
        amrex_init_namelist(filestring_fortran.c_str());
#endif
    }
}